

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O2

int lyd_dup_keys(lyd_node *new_list,lyd_node *old_list,lys_node *skip_key,ly_ctx *log_ctx,
                int options)

{
  lys_node *plVar1;
  lyd_node *node;
  lys_node *plVar2;
  int iVar3;
  lyd_node *node_00;
  ulong uVar4;
  char *pcVar5;
  lyd_node **pplVar6;
  
  plVar1 = new_list->schema;
  if (plVar1->nodetype == LYS_LIST) {
    pplVar6 = &old_list->child;
    uVar4 = 0;
    while( true ) {
      node = *pplVar6;
      if (node == (lyd_node *)0x0) break;
      if (plVar1->padding[2] <= uVar4) {
        return 0;
      }
      plVar2 = *(lys_node **)(*(long *)&plVar1[1].flags + uVar4 * 8);
      if (node->schema != plVar2) {
        pcVar5 = plVar2->name;
        goto LAB_001666e2;
      }
      if (node->schema != skip_key) {
        node_00 = lyd_dup(node,options & 2);
        if (node_00 == (lyd_node *)0x0) {
          ly_log(log_ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lyd_dup_keys");
          return -1;
        }
        iVar3 = lyd_insert(new_list,node_00);
        if (iVar3 != 0) {
          lyd_free(node_00);
          return -1;
        }
      }
      uVar4 = uVar4 + 1;
      pplVar6 = &node->next;
    }
    if (uVar4 < plVar1->padding[2]) {
      pcVar5 = (char *)**(undefined8 **)(*(long *)&plVar1[1].flags + uVar4 * 8);
LAB_001666e2:
      ly_vlog(log_ctx,LYE_PATH_INKEY,LY_VLOG_LYD,new_list,pcVar5);
      return -1;
    }
  }
  return 0;
}

Assistant:

static int
lyd_dup_keys(struct lyd_node *new_list, const struct lyd_node *old_list, struct lys_node *skip_key,
        struct ly_ctx *log_ctx, int options)
{
    struct lys_node_list *slist;
    struct lyd_node *key, *key_dup;
    uint16_t i;

    if (new_list->schema->nodetype != LYS_LIST) {
        return 0;
    }

    slist = (struct lys_node_list *)new_list->schema;
    for (key = old_list->child, i = 0; key && (i < slist->keys_size); ++i, key = key->next) {
        if (key->schema != (struct lys_node *)slist->keys[i]) {
            LOGVAL(log_ctx, LYE_PATH_INKEY, LY_VLOG_LYD, new_list, slist->keys[i]->name);
            return -1;
        }
        if (key->schema == skip_key) {
            continue;
        }

        key_dup = lyd_dup(key, options & LYD_DUP_OPT_NO_ATTR);
        LY_CHECK_ERR_RETURN(!key_dup, LOGMEM(log_ctx), -1);

        if (lyd_insert(new_list, key_dup)) {
            lyd_free(key_dup);
            return -1;
        }
    }
    if (!key && (i < slist->keys_size)) {
        LOGVAL(log_ctx, LYE_PATH_INKEY, LY_VLOG_LYD, new_list, slist->keys[i]->name);
        return -1;
    }

    return 0;
}